

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBoxArray::local_collate_cpu(TagBoxArray *this,PinnedVector<IntVect> *v)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> this_00;
  int *piVar4;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RSI;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Box *bx_1;
  Array4<const_char> *arr_1;
  IntVect *p;
  int li;
  MFIter fai_1;
  Vector<int,_std::allocator<int>_> offset;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  int c;
  Box *bx;
  Array4<const_char> *arr;
  MFIter fai;
  Vector<int,_std::allocator<int>_> count;
  allocator_type *in_stack_fffffffffffffb28;
  MFIter *in_stack_fffffffffffffb30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb38;
  FabArray<amrex::TagBox> *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb40;
  MFIter *this_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb48;
  element_type *peVar5;
  undefined8 in_stack_fffffffffffffb50;
  uchar uVar7;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pPVar6;
  FabArrayBase *in_stack_fffffffffffffb58;
  FabArrayBase *fabarray_;
  MFIter *in_stack_fffffffffffffb60;
  IntVect local_450;
  int local_444;
  int local_440;
  int local_43c;
  undefined8 local_438;
  int local_430;
  int local_424;
  int iStack_420;
  int local_41c;
  pointer local_418;
  int local_410;
  undefined8 local_408;
  int local_400;
  undefined1 local_3fc [36];
  undefined1 local_3d8 [188];
  undefined4 local_31c;
  int *local_318;
  int *local_310;
  RefID local_308;
  RefID local_300;
  int *local_2f8;
  undefined4 local_2ec;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_280;
  int local_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int local_26c;
  int iStack_268;
  __uniq_ptr_impl<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  local_260;
  long local_258 [8];
  long *local_218;
  MFIter local_210;
  undefined1 local_198 [172];
  undefined4 local_ec;
  FabArray<amrex::TagBox> *local_e8;
  undefined4 local_dc;
  FabArray<amrex::TagBox> *local_d8;
  undefined8 local_d0;
  int local_c8;
  RefID local_c0;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  undefined1 *local_a8;
  undefined4 local_9c;
  undefined1 *local_98;
  undefined4 local_8c;
  int *local_88;
  FabArray<amrex::TagBox> *local_70;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  int local_2c;
  int local_28;
  int local_24;
  FabArray<amrex::TagBox> *local_20;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  uVar7 = (uchar)((ulong)in_stack_fffffffffffffb50 >> 0x38);
  local_198._24_8_ = in_RSI;
  iVar3 = FabArrayBase::local_size((FabArrayBase *)0x136026c);
  if (iVar3 != 0) {
    FabArrayBase::local_size((FabArrayBase *)0x1360283);
    std::allocator<int>::allocator((allocator<int> *)0x136029c);
    Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
               (size_type)in_stack_fffffffffffffb28,(allocator_type *)0x13602b3);
    std::allocator<int>::~allocator((allocator<int> *)0x13602c2);
    MFIter::MFIter(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,uVar7);
    while (bVar2 = MFIter::isValid(&local_210), bVar2) {
      FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>
                ((FabArray<amrex::TagBox> *)in_stack_fffffffffffffb38._M_current,
                 in_stack_fffffffffffffb30);
      local_218 = local_258;
      MFIter::fabbox((MFIter *)in_stack_fffffffffffffb40._M_current);
      local_280 = 0;
      local_dc = 0;
      local_ec = 1;
      local_198._156_4_ = 2;
      local_38 = &iStack_270;
      local_3c = 0;
      local_48 = &iStack_270;
      local_4c = 1;
      local_58 = &iStack_270;
      local_5c = 2;
      for (local_2c4 = iStack_274; iVar3 = local_280, iVar1 = local_278, local_2c4 <= iStack_268;
          local_2c4 = local_2c4 + 1) {
        while (local_2c8 = iVar1, iVar3 = local_27c, local_2c8 <= local_26c) {
          while (local_2cc = iVar3, local_2cc <= iStack_270) {
            local_8 = local_218;
            local_c = local_2cc;
            local_10 = local_2c8;
            local_14 = local_2c4;
            if (*(char *)(*local_218 +
                         (long)(local_2cc - (int)local_218[4]) +
                         (long)(local_2c8 - *(int *)((long)local_218 + 0x24)) * local_218[1] +
                         (long)(local_2c4 - (int)local_218[5]) * local_218[2]) != '\0') {
              local_280 = local_280 + 1;
            }
            iVar3 = local_2cc + 1;
          }
          iVar1 = local_2c8 + 1;
        }
      }
      local_260._M_t.
      super__Tuple_impl<0UL,_amrex::FabArray<amrex::TagBox>_*,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
      .super__Head_base<0UL,_amrex::FabArray<amrex::TagBox>_*,_false>._M_head_impl =
           (tuple<amrex::FabArray<amrex::TagBox>_*,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
            )(tuple<amrex::FabArray<amrex::TagBox>_*,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
              )&local_27c;
      local_198._136_8_ = (FabArray<amrex::TagBox> *)&local_27c;
      local_198._160_8_ = (FabArray<amrex::TagBox> *)&local_27c;
      local_e8 = (FabArray<amrex::TagBox> *)&local_27c;
      local_d8 = (FabArray<amrex::TagBox> *)&local_27c;
      local_70 = (FabArray<amrex::TagBox> *)&local_27c;
      MFIter::LocalIndex(in_stack_fffffffffffffb30);
      piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                          (size_type)in_stack_fffffffffffffb28);
      *piVar4 = iVar3;
      MFIter::operator++(&local_210);
    }
    MFIter::~MFIter(in_stack_fffffffffffffb30);
    Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x1360751);
    local_2ec._0_1_ = false;
    local_2ec._1_3_ = 0;
    std::allocator<int>::allocator((allocator<int> *)0x1360776);
    Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40._M_current,
               (size_type)in_stack_fffffffffffffb38._M_current,
               (value_type *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    std::allocator<int>::~allocator((allocator<int> *)0x13607a4);
    fabarray_ = (FabArrayBase *)local_198;
    local_2f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb28);
    local_300.data =
         (Ref *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb28);
    local_310 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb28);
    local_308.data =
         (BARef *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffb38._M_current,
                            (difference_type)in_stack_fffffffffffffb30);
    this_00 = std::
              partial_sum<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                         in_stack_fffffffffffffb38);
    pPVar6 = (PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)local_198._24_8_;
    local_318 = this_00._M_current;
    std::vector<int,_std::allocator<int>_>::back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30);
    uVar7 = (uchar)((ulong)pPVar6 >> 0x38);
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
              ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               in_stack_fffffffffffffb40._M_current,(size_type)in_stack_fffffffffffffb38._M_current)
    ;
    bVar2 = PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::empty
                      ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                       local_198._24_8_);
    if (bVar2) {
      local_31c = 1;
    }
    else {
      MFIter::MFIter((MFIter *)this_00._M_current,fabarray_,uVar7);
      while (bVar2 = MFIter::isValid((MFIter *)(local_3d8 + 0x58)), bVar2) {
        local_3d8._84_4_ = MFIter::LocalIndex(in_stack_fffffffffffffb30);
        piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                            (size_type)in_stack_fffffffffffffb28);
        if (0 < *piVar4) {
          in_stack_fffffffffffffb30 =
               (MFIter *)
               PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::data
                         ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          local_198._24_8_);
          piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                              (size_type)in_stack_fffffffffffffb28);
          local_3d8._72_8_ = (&in_stack_fffffffffffffb30->tile_size)[(long)*piVar4 + -2].vect + 2;
          this_01 = (FabArray<amrex::TagBox> *)local_3d8;
          this_02 = (MFIter *)(local_3d8 + 0x58);
          FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>(this_01,in_stack_fffffffffffffb30);
          peVar5 = (element_type *)local_3fc;
          local_3d8._64_8_ = this_01;
          MFIter::fabbox(this_02);
          local_198._108_4_ = 0;
          local_198._64_4_ =
               *(undefined4 *)
                &(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start;
          local_198._92_4_ = 1;
          local_198._68_4_ =
               *(int *)((long)&(peVar5->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_start + 4);
          local_418 = (peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_198._76_4_ = 2;
          local_43c = *(int *)&(peVar5->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          local_88 = (int *)((long)&(peVar5->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 4);
          local_8c = 0;
          local_b8 = *local_88;
          local_98 = (undefined1 *)
                     ((long)&(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4);
          local_9c = 1;
          iStack_b4 = *(int *)&(peVar5->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          local_438._0_4_ = local_88[0];
          local_438._4_4_ = local_88[1];
          local_a8 = (undefined1 *)
                     ((long)&(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4);
          local_ac._0_1_ = true;
          local_ac._1_3_ = 0;
          local_430 = *(int *)((long)&(peVar5->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          _local_424 = local_438;
          local_41c = local_430;
          local_410 = local_43c;
          local_408 = local_418;
          local_400 = local_43c;
          local_3fc._28_8_ = peVar5;
          local_198._40_8_ = local_418;
          local_198._48_4_ = local_43c;
          local_198._56_8_ = peVar5;
          local_198._72_4_ = local_43c;
          local_198._80_8_ = peVar5;
          local_198._96_8_ = peVar5;
          local_198._112_8_ = peVar5;
          local_d0 = local_438;
          local_c8 = local_430;
          local_c0.data = (Ref *)peVar5;
          local_b0 = local_430;
          for (; local_43c <= local_41c; local_43c = local_43c + 1) {
            for (local_440 = local_408._4_4_; local_440 <= iStack_420; local_440 = local_440 + 1) {
              for (local_444 = (int)local_408; local_444 <= local_424; local_444 = local_444 + 1) {
                local_20 = (FabArray<amrex::TagBox> *)local_3d8._64_8_;
                local_24 = local_444;
                local_28 = local_440;
                local_2c = local_43c;
                if (*(char *)(*(long *)local_3d8._64_8_ +
                             (long)(local_444 - *(int *)(local_3d8._64_8_ + 0x20)) +
                             (long)(local_440 - *(int *)(local_3d8._64_8_ + 0x24)) *
                             *(long *)&((BoxArray *)(local_3d8._64_8_ + 8))->m_bat +
                             (long)(local_43c - *(int *)(local_3d8._64_8_ + 0x28)) *
                             *(long *)(local_3d8._64_8_ + 0x10)) != '\0') {
                  IntVect::IntVect(&local_450,local_444,local_440,local_43c);
                  *(undefined8 *)local_3d8._72_8_ = local_450.vect._0_8_;
                  *(int *)(local_3d8._72_8_ + 8) = local_450.vect[2];
                  local_3d8._72_8_ = (int *)(local_3d8._72_8_ + 0xc);
                }
              }
            }
          }
        }
        MFIter::operator++((MFIter *)(local_3d8 + 0x58));
      }
      local_31c = 0xe;
      MFIter::~MFIter(in_stack_fffffffffffffb30);
      local_31c = 0;
    }
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1360da8);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x1360db5);
  }
  return;
}

Assistant:

void
TagBoxArray::local_collate_cpu (Gpu::PinnedVector<IntVect>& v) const
{
    if (this->local_size() == 0) return;

    Vector<int> count(this->local_size());
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter fai(*this); fai.isValid(); ++fai)
    {
        Array4<char const> const& arr = this->const_array(fai);
        Box const& bx = fai.fabbox();
        int c = 0;
        AMREX_LOOP_3D(bx,i,j,k,
        {
            if (arr(i,j,k) != TagBox::CLEAR) ++c;
        });
        count[fai.LocalIndex()] = c;
    }

    Vector<int> offset(count.size()+1, 0);
    std::partial_sum(count.begin(), count.end(), offset.begin()+1);

    v.resize(offset.back());

    if (v.empty()) return;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter fai(*this); fai.isValid(); ++fai)
    {
        int li = fai.LocalIndex();
        if (count[li] > 0) {
            IntVect* p = v.data() + offset[li];
            Array4<char const> const& arr = this->const_array(fai);
            Box const& bx = fai.fabbox();
            AMREX_LOOP_3D(bx,i,j,k,
            {
                if (arr(i,j,k) != TagBox::CLEAR) {
                    *p++ = IntVect(AMREX_D_DECL(i,j,k));
                }
            });
        }
    }
}